

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_199c2b::SymlinkCommand::getVerboseDescription
          (SymlinkCommand *this,SmallVectorImpl<char> *result)

{
  pointer ppBVar1;
  pointer __s;
  void *pvVar2;
  void *pvVar3;
  raw_ostream *prVar4;
  char *in_RCX;
  void *__buf;
  size_type __n;
  char *extraout_RDX;
  void *__buf_00;
  char *extraout_RDX_00;
  void *__buf_01;
  void *__buf_02;
  char *pcVar5;
  bool bVar6;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  raw_svector_ostream os;
  raw_ostream local_50;
  SmallVectorImpl<char> *local_28;
  
  prVar4 = &local_50;
  local_50.BufferMode = InternalBuffer;
  local_50.OutBufStart = (char *)0x0;
  local_50.OutBufEnd = (char *)0x0;
  local_50.OutBufCur = (char *)0x0;
  local_50._vptr_raw_ostream = (_func_int **)&PTR__raw_ostream_0020d3c0;
  local_28 = result;
  llvm::raw_ostream::SetUnbuffered(prVar4);
  Str.Length = 8;
  Str.Data = "ln -sfh ";
  llvm::raw_ostream::operator<<(prVar4,Str);
  __n = (this->linkOutputPath)._M_string_length;
  if (__n == 0) {
    ppBVar1 = (this->super_Command).outputs.
              super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    __n = ((*ppBVar1)->super_Node).name._M_string_length;
    bVar6 = ppBVar1 !=
            (this->super_Command).outputs.
            super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
    in_RCX = (char *)CONCAT71((int7)((ulong)ppBVar1 >> 8),bVar6);
    if (bVar6 && __n == 0) {
      pcVar5 = "<<<missing output>>>";
      __n = 0x14;
    }
    else {
      pcVar5 = ((*ppBVar1)->super_Node).name._M_dataplus._M_p;
      if (__n != 0) goto LAB_0013f5ca;
      __n = 0;
    }
LAB_0013f628:
    Str_00.Length = __n;
    Str_00.Data = pcVar5;
    llvm::raw_ostream::operator<<(&local_50,Str_00);
    pcVar5 = extraout_RDX;
  }
  else {
    pcVar5 = (this->linkOutputPath)._M_dataplus._M_p;
LAB_0013f5ca:
    pvVar2 = memchr(pcVar5,0x20,__n);
    in_RCX = (char *)CONCAT71((int7)((ulong)in_RCX >> 8),pvVar2 == (void *)0x0);
    if ((long)pvVar2 - (long)pcVar5 == -1 || pvVar2 == (void *)0x0) goto LAB_0013f628;
    if (local_50.OutBufCur < local_50.OutBufEnd) {
      *local_50.OutBufCur = '\"';
      local_50.OutBufCur = local_50.OutBufCur + 1;
    }
    else {
      prVar4 = (raw_ostream *)llvm::raw_ostream::write(&local_50,0x22,__buf,(size_t)in_RCX);
    }
    Str_01.Length = __n;
    Str_01.Data = pcVar5;
    prVar4 = llvm::raw_ostream::operator<<(prVar4,Str_01);
    in_RCX = prVar4->OutBufCur;
    if (in_RCX < prVar4->OutBufEnd) {
      pcVar5 = in_RCX + 1;
      prVar4->OutBufCur = pcVar5;
      *in_RCX = '\"';
    }
    else {
      llvm::raw_ostream::write(prVar4,0x22,__buf_00,(size_t)in_RCX);
      pcVar5 = extraout_RDX_00;
    }
  }
  if (local_50.OutBufCur < local_50.OutBufEnd) {
    in_RCX = local_50.OutBufCur + 1;
    *local_50.OutBufCur = ' ';
    local_50.OutBufCur = in_RCX;
  }
  else {
    llvm::raw_ostream::write(&local_50,0x20,pcVar5,(size_t)in_RCX);
  }
  __s = (this->contents)._M_dataplus._M_p;
  pvVar2 = (void *)(this->contents)._M_string_length;
  if (pvVar2 != (void *)0x0) {
    pvVar3 = memchr(__s,0x20,(size_t)pvVar2);
    in_RCX = (char *)CONCAT71((int7)((ulong)in_RCX >> 8),pvVar3 == (void *)0x0);
    if ((long)pvVar3 - (long)__s != -1 && pvVar3 != (void *)0x0) {
      if (local_50.OutBufCur < local_50.OutBufEnd) {
        in_RCX = local_50.OutBufCur + 1;
        prVar4 = &local_50;
        *local_50.OutBufCur = '\"';
        local_50.OutBufCur = in_RCX;
      }
      else {
        prVar4 = (raw_ostream *)llvm::raw_ostream::write(&local_50,0x22,__buf_01,(size_t)in_RCX);
      }
      prVar4 = (raw_ostream *)
               llvm::raw_ostream::write
                         (prVar4,(int)(this->contents)._M_dataplus._M_p,
                          (void *)(this->contents)._M_string_length,(size_t)in_RCX);
      pcVar5 = prVar4->OutBufCur;
      if (pcVar5 < prVar4->OutBufEnd) {
        prVar4->OutBufCur = pcVar5 + 1;
        *pcVar5 = '\"';
      }
      else {
        llvm::raw_ostream::write(prVar4,0x22,__buf_02,(size_t)pcVar5);
      }
      goto LAB_0013f70f;
    }
  }
  llvm::raw_ostream::write(&local_50,(int)__s,pvVar2,(size_t)in_RCX);
LAB_0013f70f:
  llvm::raw_ostream::~raw_ostream(&local_50);
  return;
}

Assistant:

virtual void getVerboseDescription(SmallVectorImpl<char> &result) const override {
    llvm::raw_svector_ostream os(result);
    os << "ln -sfh ";
    StringRef outputPath = getActualOutputPath();
    if (outputs.empty() || !outputPath.empty()) {
      // FIXME: This isn't correct, we need utilities for doing shell quoting.
      if (outputPath.find(' ') != StringRef::npos) {
        os << '"' << outputPath << '"';
      } else {
        os << outputPath;
      }
    } else {
      os << "<<<missing output>>>";
    }
    os << ' ';
    // FIXME: This isn't correct, we need utilities for doing shell quoting.
    if (StringRef(contents).find(' ') != StringRef::npos) {
      os << '"' << contents << '"';
    } else {
      os << contents;
    }
  }